

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.cpp
# Opt level: O3

string * FormatHDKeypath_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *path,bool apostrophe)

{
  uint uVar1;
  uint *puVar2;
  char __c;
  uint *puVar3;
  long in_FS_OFFSET;
  uint local_5c;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar3 = (path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 != puVar2) {
    __c = 'h';
    if (apostrophe) {
      __c = '\'';
    }
    do {
      uVar1 = *puVar3;
      local_5c = uVar1 & 0x7fffffff;
      tinyformat::format<unsigned_int>(&local_58,"/%i",&local_5c);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((int)uVar1 < 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,__c);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatHDKeypath(const std::vector<uint32_t>& path, bool apostrophe)
{
    std::string ret;
    for (auto i : path) {
        ret += strprintf("/%i", (i << 1) >> 1);
        if (i >> 31) ret += apostrophe ? '\'' : 'h';
    }
    return ret;
}